

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cc
# Opt level: O0

void VerifyGraph(State *state)

{
  Test *pTVar1;
  bool bVar2;
  reference ppEVar3;
  reference ppNVar4;
  pointer pvVar5;
  Edge *pEVar6;
  vector<Edge_*,_std::allocator<Edge_*>_> *pvVar7;
  const_iterator cVar8;
  const_iterator cVar9;
  undefined1 local_128 [8];
  set<const_Edge_*,_std::less<const_Edge_*>,_std::allocator<const_Edge_*>_> edge_set;
  Edge *local_d8 [3];
  Node *local_c0;
  Node *n;
  _Node_iterator_base<std::pair<const_StringPiece,_Node_*>,_true> local_b0;
  const_iterator p;
  set<const_Edge_*,_std::less<const_Edge_*>,_std::allocator<const_Edge_*>_> node_edge_set;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_70;
  __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_68;
  const_iterator out_node;
  __normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> local_48;
  vector<Edge_*,_std::allocator<Edge_*>_> *local_40;
  vector<Edge_*,_std::allocator<Edge_*>_> *out_edges;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_30;
  __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_28;
  const_iterator in_node;
  __normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> local_18;
  const_iterator e;
  State *state_local;
  
  e._M_current = (Edge **)state;
  local_18._M_current = (Edge **)std::vector<Edge_*,_std::allocator<Edge_*>_>::begin(&state->edges_)
  ;
  while( true ) {
    in_node._M_current =
         (Node **)std::vector<Edge_*,_std::allocator<Edge_*>_>::end
                            ((vector<Edge_*,_std::allocator<Edge_*>_> *)(e._M_current + 0xd));
    bVar2 = __gnu_cxx::operator!=
                      (&local_18,
                       (__normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>
                        *)&in_node);
    pTVar1 = g_current_test;
    if (!bVar2) break;
    ppEVar3 = __gnu_cxx::
              __normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
              operator*(&local_18);
    bVar2 = std::vector<Node_*,_std::allocator<Node_*>_>::empty(&(*ppEVar3)->outputs_);
    testing::Test::Check
              (pTVar1,(bool)((bVar2 ^ 0xffU) & 1),
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/test.cc",0x75,
               "(*e)->outputs_.empty()");
    ppEVar3 = __gnu_cxx::
              __normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
              operator*(&local_18);
    local_30._M_current =
         (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin(&(*ppEVar3)->inputs_);
    __gnu_cxx::__normal_iterator<Node*const*,std::vector<Node*,std::allocator<Node*>>>::
    __normal_iterator<Node**>
              ((__normal_iterator<Node*const*,std::vector<Node*,std::allocator<Node*>>> *)&local_28,
               &local_30);
    while( true ) {
      ppEVar3 = __gnu_cxx::
                __normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
                operator*(&local_18);
      out_edges = (vector<Edge_*,_std::allocator<Edge_*>_> *)
                  std::vector<Node_*,_std::allocator<Node_*>_>::end(&(*ppEVar3)->inputs_);
      bVar2 = __gnu_cxx::operator!=
                        (&local_28,
                         (__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                          *)&out_edges);
      if (!bVar2) break;
      ppNVar4 = __gnu_cxx::
                __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                operator*(&local_28);
      local_40 = Node::out_edges(*ppNVar4);
      pTVar1 = g_current_test;
      cVar8 = std::vector<Edge_*,_std::allocator<Edge_*>_>::begin(local_40);
      cVar9 = std::vector<Edge_*,_std::allocator<Edge_*>_>::end(local_40);
      ppEVar3 = __gnu_cxx::
                __normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
                operator*(&local_18);
      local_48 = std::
                 find<__gnu_cxx::__normal_iterator<Edge*const*,std::vector<Edge*,std::allocator<Edge*>>>,Edge*>
                           (cVar8._M_current,cVar9._M_current,ppEVar3);
      out_node._M_current = (Node **)std::vector<Edge_*,_std::allocator<Edge_*>_>::end(local_40);
      bVar2 = __gnu_cxx::operator!=
                        (&local_48,
                         (__normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>
                          *)&out_node);
      testing::Test::Check
                (pTVar1,bVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/test.cc",
                 0x7b,"find(out_edges.begin(), out_edges.end(), *e) != out_edges.end()");
      __gnu_cxx::__normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
      operator++(&local_28);
    }
    ppEVar3 = __gnu_cxx::
              __normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
              operator*(&local_18);
    local_70._M_current =
         (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin(&(*ppEVar3)->outputs_);
    __gnu_cxx::__normal_iterator<Node*const*,std::vector<Node*,std::allocator<Node*>>>::
    __normal_iterator<Node**>
              ((__normal_iterator<Node*const*,std::vector<Node*,std::allocator<Node*>>> *)&local_68,
               &local_70);
    while( true ) {
      ppEVar3 = __gnu_cxx::
                __normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
                operator*(&local_18);
      node_edge_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)std::vector<Node_*,_std::allocator<Node_*>_>::end(&(*ppEVar3)->outputs_);
      bVar2 = __gnu_cxx::operator!=
                        (&local_68,
                         (__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                          *)&node_edge_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
      pTVar1 = g_current_test;
      if (!bVar2) break;
      ppNVar4 = __gnu_cxx::
                __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                operator*(&local_68);
      pEVar6 = Node::in_edge(*ppNVar4);
      ppEVar3 = __gnu_cxx::
                __normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
                operator*(&local_18);
      testing::Test::Check
                (pTVar1,pEVar6 == *ppEVar3,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/test.cc",
                 0x80,"(*out_node)->in_edge() == *e");
      __gnu_cxx::__normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
      operator++(&local_68);
    }
    __gnu_cxx::__normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
    operator++(&local_18);
  }
  std::set<const_Edge_*,_std::less<const_Edge_*>,_std::allocator<const_Edge_*>_>::set
            ((set<const_Edge_*,_std::less<const_Edge_*>,_std::allocator<const_Edge_*>_> *)&p);
  local_b0._M_cur =
       (__node_type *)
       std::
       unordered_map<StringPiece,_Node_*,_std::hash<StringPiece>,_std::equal_to<StringPiece>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>_>
       ::begin((unordered_map<StringPiece,_Node_*,_std::hash<StringPiece>,_std::equal_to<StringPiece>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>_>
                *)e._M_current);
  while( true ) {
    n = (Node *)std::
                unordered_map<StringPiece,_Node_*,_std::hash<StringPiece>,_std::equal_to<StringPiece>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>_>
                ::end((unordered_map<StringPiece,_Node_*,_std::hash<StringPiece>,_std::equal_to<StringPiece>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>_>
                       *)e._M_current);
    bVar2 = std::__detail::operator!=
                      (&local_b0,
                       (_Node_iterator_base<std::pair<const_StringPiece,_Node_*>,_true> *)&n);
    if (!bVar2) break;
    pvVar5 = std::__detail::_Node_const_iterator<std::pair<const_StringPiece,_Node_*>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_StringPiece,_Node_*>,_false,_true> *
                          )&local_b0);
    local_c0 = pvVar5->second;
    pEVar6 = Node::in_edge(local_c0);
    if (pEVar6 != (Edge *)0x0) {
      local_d8[0] = Node::in_edge(local_c0);
      std::set<const_Edge_*,_std::less<const_Edge_*>,_std::allocator<const_Edge_*>_>::insert
                ((set<const_Edge_*,_std::less<const_Edge_*>,_std::allocator<const_Edge_*>_> *)&p,
                 local_d8);
    }
    pvVar7 = Node::out_edges(local_c0);
    cVar8 = std::vector<Edge_*,_std::allocator<Edge_*>_>::begin(pvVar7);
    pvVar7 = Node::out_edges(local_c0);
    edge_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)std::vector<Edge_*,_std::allocator<Edge_*>_>::end(pvVar7);
    std::set<Edge_const*,std::less<Edge_const*>,std::allocator<Edge_const*>>::
    insert<__gnu_cxx::__normal_iterator<Edge*const*,std::vector<Edge*,std::allocator<Edge*>>>>
              ((set<Edge_const*,std::less<Edge_const*>,std::allocator<Edge_const*>> *)&p,
               (__normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>)
               cVar8._M_current,
               (__normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>)
               edge_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__detail::_Node_const_iterator<std::pair<const_StringPiece,_Node_*>,_false,_true>::
    operator++((_Node_const_iterator<std::pair<const_StringPiece,_Node_*>,_false,_true> *)&local_b0)
    ;
  }
  cVar8 = std::vector<Edge_*,_std::allocator<Edge_*>_>::begin
                    ((vector<Edge_*,_std::allocator<Edge_*>_> *)(e._M_current + 0xd));
  cVar9 = std::vector<Edge_*,_std::allocator<Edge_*>_>::end
                    ((vector<Edge_*,_std::allocator<Edge_*>_> *)(e._M_current + 0xd));
  std::set<Edge_const*,std::less<Edge_const*>,std::allocator<Edge_const*>>::
  set<__gnu_cxx::__normal_iterator<Edge*const*,std::vector<Edge*,std::allocator<Edge*>>>>
            ((set<Edge_const*,std::less<Edge_const*>,std::allocator<Edge_const*>> *)local_128,
             (__normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>)
             cVar8._M_current,
             (__normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>)
             cVar9._M_current);
  pTVar1 = g_current_test;
  bVar2 = std::operator==((set<const_Edge_*,_std::less<const_Edge_*>,_std::allocator<const_Edge_*>_>
                           *)&p,(set<const_Edge_*,_std::less<const_Edge_*>,_std::allocator<const_Edge_*>_>
                                 *)local_128);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/test.cc",0x8e,
             "node_edge_set == edge_set");
  std::set<const_Edge_*,_std::less<const_Edge_*>,_std::allocator<const_Edge_*>_>::~set
            ((set<const_Edge_*,_std::less<const_Edge_*>,_std::allocator<const_Edge_*>_> *)local_128)
  ;
  std::set<const_Edge_*,_std::less<const_Edge_*>,_std::allocator<const_Edge_*>_>::~set
            ((set<const_Edge_*,_std::less<const_Edge_*>,_std::allocator<const_Edge_*>_> *)&p);
  return;
}

Assistant:

void VerifyGraph(const State& state) {
  for (vector<Edge*>::const_iterator e = state.edges_.begin();
       e != state.edges_.end(); ++e) {
    // All edges need at least one output.
    EXPECT_FALSE((*e)->outputs_.empty());
    // Check that the edge's inputs have the edge as out-edge.
    for (vector<Node*>::const_iterator in_node = (*e)->inputs_.begin();
         in_node != (*e)->inputs_.end(); ++in_node) {
      const vector<Edge*>& out_edges = (*in_node)->out_edges();
      EXPECT_NE(find(out_edges.begin(), out_edges.end(), *e),
                out_edges.end());
    }
    // Check that the edge's outputs have the edge as in-edge.
    for (vector<Node*>::const_iterator out_node = (*e)->outputs_.begin();
         out_node != (*e)->outputs_.end(); ++out_node) {
      EXPECT_EQ((*out_node)->in_edge(), *e);
    }
  }

  // The union of all in- and out-edges of each nodes should be exactly edges_.
  set<const Edge*> node_edge_set;
  for (State::Paths::const_iterator p = state.paths_.begin();
       p != state.paths_.end(); ++p) {
    const Node* n = p->second;
    if (n->in_edge())
      node_edge_set.insert(n->in_edge());
    node_edge_set.insert(n->out_edges().begin(), n->out_edges().end());
  }
  set<const Edge*> edge_set(state.edges_.begin(), state.edges_.end());
  EXPECT_EQ(node_edge_set, edge_set);
}